

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O3

Matrix<double,_2,_3,_0,_2,_3> *
projects::ipdg_stokes::mesh::computeTangentials
          (Matrix<double,_2,_3,_0,_2,_3> *__return_storage_ptr__,Entity *entity)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  Matrix<double,_2,_3,_0,_2,_3> normals;
  assign_op<double,_double> local_f1;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> local_f0;
  Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false> local_d0;
  Matrix<double,_2,_3,_0,_2,_3> local_98;
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>_>
  local_60;
  
  computeOutwardNormals(&local_98,entity);
  pdVar3 = local_98.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
           array + 1;
  local_60.m_xpr.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false,_true>.m_startRow.
  m_value = 1;
  local_60.m_xpr.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.m_xpr.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false,_true>.m_outerStride
       = 1;
  local_f0.m_row = 0;
  local_f0.m_col = 3;
  local_f0.m_currentBlockRows = 1;
  local_f0.m_xpr = __return_storage_ptr__;
  local_60.m_xpr.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>,_0>.m_data =
       pdVar3;
  local_60.m_xpr.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false,_true>.m_xpr =
       &local_98;
  Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_-1,_-1,_false>::Block
            (&local_d0,__return_storage_ptr__,0,0,1,3);
  Eigen::internal::
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,2,3,0,2,3>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,2,3,0,2,3>const,1,3,false>const>,double,double>
            (&local_d0,&local_60,&local_f1);
  if (0 < local_d0.
          super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_0>.m_cols
          .m_value) {
    lVar1 = 0;
    do {
      if (0 < local_d0.
              super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_0>.
              m_rows.m_value) {
        lVar2 = 0;
        do {
          local_d0.
          super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_0>.m_data
          [lVar2] = -pdVar3[lVar2];
          lVar2 = lVar2 + 1;
        } while (local_d0.
                 super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_0>
                 .m_rows.m_value != lVar2);
      }
      lVar1 = lVar1 + 1;
      pdVar3 = pdVar3 + 2;
      local_d0.super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_0>.m_data =
           local_d0.
           super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_0>.
           m_data + 2;
    } while (lVar1 != local_d0.
                      super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_0>
                      .m_cols.m_value);
  }
  local_d0.super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)0x0;
  local_d0.super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>.m_startRow.
  m_value = 0;
  local_d0.super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>.m_startCol.
  m_value = 1;
  local_d0.super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_98;
  local_d0.super_BlockImpl<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_3,_0,_2,_3>,__1,__1,_false>,_0>.m_cols.m_value
       = (long)&local_98;
  Eigen::CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>> *)&local_f0,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>_> *)
             &local_d0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::finished(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix<double, 2, 3> computeTangentials(const lf::mesh::Entity &entity) {
  // Compute the tangentials from the rotated normals
  const auto normals = computeOutwardNormals(entity);
  Eigen::Matrix<double, 2, 3> tang;
  tang << -normals.row(1), normals.row(0);
  return tang;
}